

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O2

void __thiscall Iex_2_5::BaseExc::BaseExc(BaseExc *this,stringstream *s)

{
  allocator<char> local_9;
  
  *(undefined ***)this = &PTR__TypeExc_00164690;
  std::__cxx11::stringbuf::str();
  if ((anonymous_namespace)::currentStackTracer_abi_cxx11_ == (code *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&this->_stackTrace,"",&local_9);
  }
  else {
    (*(anonymous_namespace)::currentStackTracer_abi_cxx11_)(&this->_stackTrace);
  }
  return;
}

Assistant:

BaseExc::BaseExc (std::stringstream &s) throw () :
    _message (s.str()),
    _stackTrace (currentStackTracer? currentStackTracer(): "")
{
    // empty
}